

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall
crnd::crn_unpacker::unpack_dxn
          (crn_unpacker *this,uint8 **pDst,uint32 row_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  bool bVar1;
  uint32 uVar2;
  uint new_size;
  uint32 uVar3;
  uint uVar4;
  uint32 uVar5;
  block_buffer_element *pbVar6;
  unsigned_short *puVar7;
  unsigned_short *puVar8;
  unsigned_short *puVar9;
  bool local_95;
  uint16 *pAlpha1_selectors;
  uint16 *pAlpha0_selectors;
  uint32 alpha1_selector_index;
  uint32 alpha0_selector_index;
  uint8 endpoint_reference;
  block_buffer_element *buffer;
  uint32 x;
  bool visible;
  uint8 *puStack_50;
  uint32 y;
  uint32 *pData;
  byte local_3d;
  uint32 f;
  uint uStack_38;
  uint8 reference_group;
  uint32 alpha1_endpoint_index;
  uint32 alpha0_endpoint_index;
  int32 delta_pitch_in_dwords;
  uint32 height;
  uint32 width;
  uint32 num_alpha_endpoints;
  uint32 output_height_local;
  uint32 output_width_local;
  uint32 row_pitch_in_bytes_local;
  uint8 **pDst_local;
  crn_unpacker *this_local;
  
  uVar2 = vector<unsigned_short>::size(&this->m_alpha_endpoints);
  new_size = output_width + 1 & 0xfffffffe;
  uVar3 = vector<crnd::crn_unpacker::block_buffer_element>::size(&this->m_block_buffer);
  if (uVar3 < new_size) {
    vector<crnd::crn_unpacker::block_buffer_element>::resize(&this->m_block_buffer,new_size);
  }
  uStack_38 = 0;
  f = 0;
  local_3d = 0;
  for (pData._4_4_ = 0;
      uVar4 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&this->m_pHeader->m_faces), pData._4_4_ < uVar4;
      pData._4_4_ = pData._4_4_ + 1) {
    puStack_50 = pDst[pData._4_4_];
    for (x = 0; x < (output_height + 1 & 0xfffffffe); x = x + 1) {
      bVar1 = x < output_height;
      for (buffer._4_4_ = 0; buffer._4_4_ < new_size; buffer._4_4_ = buffer._4_4_ + 1) {
        local_95 = bVar1 && buffer._4_4_ < output_width;
        if (((x & 1) == 0) && ((buffer._4_4_ & 1) == 0)) {
          uVar3 = symbol_codec::decode(&this->m_codec,&this->m_reference_encoding_dm);
          local_3d = (byte)uVar3;
        }
        pbVar6 = vector<crnd::crn_unpacker::block_buffer_element>::operator[]
                           (&this->m_block_buffer,buffer._4_4_);
        if ((x & 1) == 0) {
          alpha1_selector_index._3_1_ = local_3d & 3;
          pbVar6->endpoint_reference = (byte)((int)(uint)local_3d >> 2) & 3;
          local_3d = (byte)((int)(uint)local_3d >> 4);
        }
        else {
          alpha1_selector_index._3_1_ = (byte)pbVar6->endpoint_reference;
        }
        if (alpha1_selector_index._3_1_ == 0) {
          uVar3 = symbol_codec::decode(&this->m_codec,this->m_endpoint_delta_dm + 1);
          uStack_38 = uVar3 + uStack_38;
          if (uVar2 <= uStack_38) {
            uStack_38 = uStack_38 - uVar2;
          }
          pbVar6->alpha0_endpoint_index = (uint16)uStack_38;
          uVar3 = symbol_codec::decode(&this->m_codec,this->m_endpoint_delta_dm + 1);
          f = uVar3 + f;
          if (uVar2 <= f) {
            f = f - uVar2;
          }
          pbVar6->alpha1_endpoint_index = (uint16)f;
        }
        else if (alpha1_selector_index._3_1_ == 1) {
          pbVar6->alpha0_endpoint_index = (uint16)uStack_38;
          pbVar6->alpha1_endpoint_index = (uint16)f;
        }
        else {
          uStack_38 = (uint)pbVar6->alpha0_endpoint_index;
          f = (uint32)pbVar6->alpha1_endpoint_index;
        }
        uVar3 = symbol_codec::decode(&this->m_codec,this->m_selector_delta_dm + 1);
        uVar5 = symbol_codec::decode(&this->m_codec,this->m_selector_delta_dm + 1);
        if (bVar1 && buffer._4_4_ < output_width) {
          puVar7 = vector<unsigned_short>::operator[](&this->m_alpha_selectors,uVar3 * 3);
          puVar8 = vector<unsigned_short>::operator[](&this->m_alpha_selectors,uVar5 * 3);
          puVar9 = vector<unsigned_short>::operator[](&this->m_alpha_endpoints,uStack_38);
          *(uint *)puStack_50 = CONCAT22(*puVar7,*puVar9);
          *(undefined4 *)(puStack_50 + 4) = *(undefined4 *)(puVar7 + 1);
          puVar7 = vector<unsigned_short>::operator[](&this->m_alpha_endpoints,f);
          *(uint *)(puStack_50 + 8) = CONCAT22(*puVar8,*puVar7);
          *(undefined4 *)(puStack_50 + 0xc) = *(undefined4 *)(puVar8 + 1);
        }
        puStack_50 = puStack_50 + 0x10;
        bVar1 = local_95;
      }
      puStack_50 = puStack_50 + (long)(int)((row_pitch_in_bytes >> 2) + new_size * -4) * 4;
    }
  }
  return true;
}

Assistant:

bool unpack_dxn(uint8** pDst, uint32 row_pitch_in_bytes, uint32 output_width, uint32 output_height)
        {
            const uint32 num_alpha_endpoints = m_alpha_endpoints.size();
            const uint32 width = (output_width + 1) & ~1;
            const uint32 height = (output_height + 1) & ~1;
            const int32 delta_pitch_in_dwords = (row_pitch_in_bytes >> 2) - (width << 2);

            if (m_block_buffer.size() < width)
                m_block_buffer.resize(width);

            uint32 alpha0_endpoint_index = 0;
            uint32 alpha1_endpoint_index = 0;
            uint8 reference_group = 0;

            for (uint32 f = 0; f < m_pHeader->m_faces; f++)
            {
                uint32* pData = (uint32*)pDst[f];
                for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords)
                {
                    bool visible = y < output_height;
                    for (uint32 x = 0; x < width; x++, pData += 4)
                    {
                        visible = visible && x < output_width;
                        if (!(y & 1) && !(x & 1))
                            reference_group = m_codec.decode(m_reference_encoding_dm);
                        block_buffer_element& buffer = m_block_buffer[x];
                        uint8 endpoint_reference;
                        if (y & 1)
                        {
                            endpoint_reference = buffer.endpoint_reference;
                        }
                        else
                        {
                            endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                            buffer.endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                        }
                        if (!endpoint_reference)
                        {
                            alpha0_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
                            if (alpha0_endpoint_index >= num_alpha_endpoints)
                                alpha0_endpoint_index -= num_alpha_endpoints;
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                            alpha1_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
                            if (alpha1_endpoint_index >= num_alpha_endpoints)
                                alpha1_endpoint_index -= num_alpha_endpoints;
                            buffer.alpha1_endpoint_index = alpha1_endpoint_index;
                        }
                        else if (endpoint_reference == 1)
                        {
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                            buffer.alpha1_endpoint_index = alpha1_endpoint_index;
                        }
                        else
                        {
                            alpha0_endpoint_index = buffer.alpha0_endpoint_index;
                            alpha1_endpoint_index = buffer.alpha1_endpoint_index;
                        }
                        uint32 alpha0_selector_index = m_codec.decode(m_selector_delta_dm[1]);
                        uint32 alpha1_selector_index = m_codec.decode(m_selector_delta_dm[1]);
                        if (visible)
                        {
                            const uint16* pAlpha0_selectors = &m_alpha_selectors[alpha0_selector_index * 3];
                            const uint16* pAlpha1_selectors = &m_alpha_selectors[alpha1_selector_index * 3];
                            pData[0] = m_alpha_endpoints[alpha0_endpoint_index] | (pAlpha0_selectors[0] << 16);
                            pData[1] = pAlpha0_selectors[1] | (pAlpha0_selectors[2] << 16);
                            pData[2] = m_alpha_endpoints[alpha1_endpoint_index] | (pAlpha1_selectors[0] << 16);
                            pData[3] = pAlpha1_selectors[1] | (pAlpha1_selectors[2] << 16);
                        }
                    }
                }
            }
            return true;
        }